

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::~QHttpThreadDelegate(QHttpThreadDelegate *this)

{
  bool bVar1;
  QNetworkAccessCache **ppQVar2;
  
  *(undefined ***)this = &PTR_metaObject_002cdb80;
  if (*(long **)(this + 0x150) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x150) + 0x20))();
  }
  bVar1 = QThreadStorage<QNetworkAccessCache_*>::hasLocalData(&connections);
  if ((bVar1) && (*(long *)(this + 0x148) != 0)) {
    ppQVar2 = QThreadStorage<QNetworkAccessCache_*>::localData(&connections);
    QNetworkAccessCache::releaseEntry((QNetworkAccessCache *)*ppQVar2,(QByteArray *)(this + 0x138));
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(this + 0x138));
  QSharedPointer<char>::deref((QSharedPointer<char> *)(this + 0x120));
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)(this + 0x118));
  QHttp1Configuration::~QHttp1Configuration((QHttp1Configuration *)(this + 0x110));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(this + 0xf8));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(this + 0xc0));
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)(this + 0xb0));
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(this + 0x98));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x80));
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)(this + 0x70));
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)(this + 0x68));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x60));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x50));
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)(this + 0x20));
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::~QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
             (this + 0x18));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QHttpThreadDelegate::~QHttpThreadDelegate()
{
    // It could be that the main thread has asked us to shut down, so we need to delete the HTTP reply
    if (httpReply) {
        delete httpReply;
    }

    // Get the object cache that stores our QHttpNetworkConnection objects
    // and release the entry for this QHttpNetworkConnection
    if (connections.hasLocalData() && !cacheKey.isEmpty()) {
        connections.localData()->releaseEntry(cacheKey);
    }
}